

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O3

void DivisionHelper<signed_char,_long_long,_5>::
     DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (char *t,longlong *u,char *result)

{
  char cVar1;
  
  if (*u != 0) {
    if ((long)*t == 0) {
      cVar1 = '\0';
    }
    else {
      cVar1 = (char)((long)*t / *u);
    }
    *result = cVar1;
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
}

Assistant:

SAFEINT_CONSTEXPR14 static void DivideThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if(u == 0)
        {
            E::SafeIntOnDivZero();
        }

        if( t == 0 )
        {
            result = 0;
            return;
        }

        // Must test for corner case
        if( t == std::numeric_limits<T>::min() && u == (U)-1 )
            E::SafeIntOnOverflow();

        result = (T)( t/u );
    }